

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O0

void safe_strcpy(char *dst,size_t dstlen,char *src)

{
  size_t srclen;
  char *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  
  if (in_RDX == (char *)0x0) {
    srclen = 0;
  }
  else {
    srclen = strlen(in_RDX);
  }
  safe_strcpyl(in_RDX,in_RSI,in_RDI,srclen);
  return;
}

Assistant:

void safe_strcpy(char *dst, size_t dstlen, const char *src)
{
    safe_strcpyl(dst, dstlen, src, src != 0 ? strlen(src) : 0);
}